

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O3

int RookMobility(Situation *s)

{
  byte bVar1;
  int iVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  int *piVar8;
  bool bVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  int local_38;
  int local_34;
  
  local_38 = 0;
  local_34 = 0;
  lVar4 = 0x10;
  piVar8 = &local_38;
  bVar3 = true;
  do {
    bVar9 = bVar3;
    lVar5 = 0;
    do {
      bVar1 = s->current_pieces[lVar5 + lVar4 + 7];
      if (bVar1 != 0) {
        uVar12 = (ulong)((bVar1 & 0xf) << 0xc);
        uVar6 = (uint)*(byte *)(uVar12 + 0x305d50 + (ulong)s->bit_row[bVar1 >> 4] * 8) -
                (uint)*(byte *)(uVar12 + 0x305d51 + (ulong)s->bit_row[bVar1 >> 4] * 8);
        uVar11 = -uVar6;
        if (0 < (int)uVar6) {
          uVar11 = uVar6;
        }
        lVar10 = (ulong)(bVar1 >> 4) * 0x2000;
        uVar7 = (uint)*(byte *)(lVar10 + 0x30bd50 + (ulong)s->bit_col[bVar1 & 0xf] * 8) -
                (uint)*(byte *)(lVar10 + 0x30bd51 + (ulong)s->bit_col[bVar1 & 0xf] * 8);
        uVar6 = -uVar7;
        if (0 < (int)uVar7) {
          uVar6 = uVar7;
        }
        *piVar8 = (uVar6 & 0xff) + (uVar11 & 0xff) + *piVar8;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 2);
    lVar4 = 0x20;
    piVar8 = &local_34;
    bVar3 = false;
  } while (bVar9);
  iVar2 = -(local_38 - local_34);
  if (s->current_player == 0) {
    iVar2 = local_38 - local_34;
  }
  return iVar2;
}

Assistant:

int RookMobility(Situation &s)
{
    int SideTag;
    int rook_mobility[2] = {0};
    for (int r = 0; r < 2; r++)
    {
        SideTag = 16 + (r << 4);
        for (int i = 7; i <= 8; i++)
        {
            if (s.current_pieces[SideTag + i] != 0)
            {
                int piece_from = s.current_pieces[SideTag + i];
                int col = GetCol(piece_from), row = GetRow(piece_from);

                int get_col_1 = ROOK_CANNON_CAN_GET_ROW[col - 3][s.bit_row[row]].no_capture[0]; //右方向
                int get_col_2 = ROOK_CANNON_CAN_GET_ROW[col - 3][s.bit_row[row]].no_capture[1]; //左方向
                rook_mobility[r] += abs(get_col_1 - get_col_2);

                int get_row_1 = ROOK_CANNON_CAN_GET_COL[row - 3][s.bit_col[col]].no_capture[0]; //下方向
                int get_row_2 = ROOK_CANNON_CAN_GET_COL[row - 3][s.bit_col[col]].no_capture[1]; //上方向
                rook_mobility[r] += abs(get_row_1 - get_row_2);
            }
        }
    }

    return SideValue(s.current_player, rook_mobility[RED] - rook_mobility[BLACK]);
}